

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalFunction.cpp
# Opt level: O1

void __thiscall LocalFunction::LocalFunction(LocalFunction *this,Stream *stream)

{
  uint uVar1;
  int iVar2;
  ICommand *pIVar3;
  uint *puVar4;
  runtime_error *this_00;
  ulong uVar5;
  
  uVar1 = (**stream->_vptr_Stream)(stream);
  this->name = uVar1;
  pIVar3 = loadCommand(stream);
  iVar2 = (*pIVar3->_vptr_ICommand[1])(pIVar3);
  if ((char)iVar2 == '\b') {
    this->code = pIVar3;
    uVar1 = (**stream->_vptr_Stream)(stream);
    this->argsCount = uVar1;
    puVar4 = (uint *)operator_new__((ulong)uVar1 << 2);
    this->args = puVar4;
    if (uVar1 != 0) {
      uVar5 = 0;
      do {
        uVar1 = (**stream->_vptr_Stream)(stream);
        this->args[uVar5] = uVar1;
        uVar5 = uVar5 + 1;
      } while (uVar5 < this->argsCount);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Local function block must have type SCRIPT_BLOCK!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

LocalFunction::LocalFunction(Stream *stream) {
	this->name = stream->readInt();
	
	ICommand* block = loadCommand(stream);
	if (block->getType() != CT_SCRIPT_BLOCK) {
		throw std::runtime_error("Local function block must have type SCRIPT_BLOCK!");
	}
	this->code = block;
	
	this->argsCount = stream->readInt();
	unsigned int i;
	this->args = new unsigned int[this->argsCount];
	for (i = 0; i < this->argsCount; i++) {
		this->args[i] = stream->readInt();
	}
}